

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

iterator * __thiscall
google::
dense_hashtable<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>,int,std::hash<int>,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SelectKey,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>
::insert_at<int,std::unique_ptr<int,std::default_delete<int>>>
          (iterator *__return_storage_ptr__,
          dense_hashtable<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>,int,std::hash<int>,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SelectKey,google::dense_hash_map<int,std::unique_ptr<int,std::default_delete<int>>,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::unique_ptr<int,std::default_delete<int>>>>>
          *this,size_type pos,int *args,unique_ptr<int,_std::default_delete<int>_> *args_1)

{
  long lVar1;
  long lVar2;
  length_error *this_00;
  
  lVar1 = *(long *)(this + 0x28);
  if ((ulong)(*(long *)(this + 0x30) - lVar1) < 0xfffffffffffffff) {
    if ((lVar1 == 0) || (*(int *)(this + 0x20) != *(int *)(*(long *)(this + 0x48) + pos * 0x10))) {
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
    }
    else {
      *(long *)(this + 0x28) = lVar1 + -1;
    }
    set_value<int,std::unique_ptr<int,std::default_delete<int>>>
              (this,(pointer)(*(long *)(this + 0x48) + pos * 0x10),args,args_1);
    lVar1 = *(long *)(this + 0x38);
    lVar2 = *(long *)(this + 0x48);
    __return_storage_ptr__->ht =
         (dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
          *)this;
    __return_storage_ptr__->pos = (pointer)(pos * 0x10 + lVar2);
    __return_storage_ptr__->end = (pointer)(lVar1 * 0x10 + lVar2);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

iterator insert_at(size_type pos, Args&&... args) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if (test_deleted(pos)) {  // just replace if it's been del.
      // shrug: shouldn't need to be const.
      const_iterator delpos(this, table + pos, table + num_buckets, false);
      clear_deleted(delpos);
      assert(num_deleted > 0);
      --num_deleted;  // used to be, now it isn't
    } else {
      ++num_elements;  // replacing an empty bucket
    }
    set_value(&table[pos], std::forward<Args>(args)...);
    return iterator(this, table + pos, table + num_buckets, false);
  }